

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseVersionNum(xmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  ulong uVar2;
  xmlChar *pxVar3;
  xmlChar xVar4;
  ulong uVar5;
  int iVar6;
  
  pxVar1 = (xmlChar *)(*xmlMallocAtomic)(10);
  if (pxVar1 == (xmlChar *)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
  }
  else {
    xVar4 = *ctxt->input->cur;
    if ((byte)(xVar4 - 0x30) < 10) {
      *pxVar1 = xVar4;
      xmlNextChar(ctxt);
      if (*ctxt->input->cur == '.') {
        pxVar1[1] = '.';
        xmlNextChar(ctxt);
        xVar4 = *ctxt->input->cur;
        uVar2 = 2;
        if ((byte)(xVar4 - 0x30) < 10) {
          iVar6 = 10;
          pxVar3 = pxVar1;
          uVar5 = 2;
          do {
            uVar2 = uVar5 + 1;
            pxVar1 = pxVar3;
            if ((long)iVar6 <= (long)uVar2) {
              iVar6 = iVar6 * 2;
              pxVar1 = (xmlChar *)(*xmlRealloc)(pxVar3,(long)iVar6);
              if (pxVar1 == (xmlChar *)0x0) {
                (*xmlFree)(pxVar3);
                xmlErrMemory(ctxt,(char *)0x0);
                return (xmlChar *)0x0;
              }
            }
            pxVar1[uVar5] = xVar4;
            xmlNextChar(ctxt);
            xVar4 = *ctxt->input->cur;
            pxVar3 = pxVar1;
            uVar5 = uVar2;
          } while ((byte)(xVar4 - 0x30) < 10);
          uVar2 = uVar2 & 0xffffffff;
        }
        pxVar1[uVar2] = '\0';
        return pxVar1;
      }
    }
    (*xmlFree)(pxVar1);
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseVersionNum(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = 10;
    xmlChar cur;

    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	return(NULL);
    }
    cur = CUR;
    if (!((cur >= '0') && (cur <= '9'))) {
	xmlFree(buf);
	return(NULL);
    }
    buf[len++] = cur;
    NEXT;
    cur=CUR;
    if (cur != '.') {
	xmlFree(buf);
	return(NULL);
    }
    buf[len++] = cur;
    NEXT;
    cur=CUR;
    while ((cur >= '0') && (cur <= '9')) {
	if (len + 1 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt, NULL);
		return(NULL);
	    }
	    buf = tmp;
	}
	buf[len++] = cur;
	NEXT;
	cur=CUR;
    }
    buf[len] = 0;
    return(buf);
}